

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O2

int hydro_kx_aead_decrypt(hydro_kx_state *state,uint8_t *m,uint8_t *c,size_t clen)

{
  ulong n;
  uint32_t uVar1;
  int iVar2;
  size_t n_00;
  uint32_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  bool bVar6;
  uint32_t pub_mac [4];
  uint32_t int_state [12];
  uint8_t k [32];
  
  pub_mac._0_8_ = *(undefined8 *)c;
  pub_mac._8_8_ = *(undefined8 *)(c + 8);
  n = clen - 0x10;
  hydro_kx_aead_init((uint8_t *)int_state,k,state);
  hydro_hash_update(&state->h_st,c,clen);
  uVar5 = n >> 4;
  puVar3 = (uint32_t *)(c + 0x10);
  puVar4 = m;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    mem_xor2(puVar4,puVar3,int_state,0x10);
    int_state._0_8_ = *(undefined8 *)puVar3;
    int_state._8_8_ = *(undefined8 *)(puVar3 + 2);
    gimli_core_u8((uint8_t *)int_state,'\x02');
    puVar3 = puVar3 + 4;
    puVar4 = puVar4 + 0x10;
  }
  uVar5 = clen & 0xf;
  if (uVar5 != 0) {
    puVar4 = (uint8_t *)((long)(c + 0x10) + (n & 0xfffffffffffffff0));
    mem_xor2(m + (n & 0xfffffffffffffff0),puVar4,int_state,uVar5);
    mem_cpy(int_state,puVar4,uVar5);
  }
  *(byte *)((long)int_state + uVar5) = *(byte *)((long)int_state + uVar5) ^ 1;
  int_state._8_8_ = int_state._8_8_ ^ 0x8000000000000000;
  gimli_core_u8((uint8_t *)int_state,'\x02');
  hydro_kx_aead_final((uint8_t *)int_state,k);
  puVar3 = pub_mac;
  uVar1 = hydro_mem_ct_cmp_u32(int_state + 4,puVar3,n_00);
  hydro_mem_ct_zero_u32(int_state,(size_t)puVar3);
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    mem_zero(m,n);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
hydro_kx_aead_decrypt(hydro_kx_state *state, uint8_t *m, const uint8_t *c, size_t clen)
{
    _hydro_attr_aligned_(16) uint32_t int_state[gimli_BLOCKBYTES / 4];
    uint32_t                          pub_mac[hydro_kx_AEAD_MACBYTES / 4];
    uint8_t                           k[hydro_kx_AEAD_KEYBYTES];
    uint8_t                          *aead_state = (uint8_t *) (void *) int_state;
    const uint8_t                    *mac;
    const uint8_t                    *ct;
    size_t                            mlen;
    uint32_t                          cv;

    if (clen < hydro_kx_AEAD_MACBYTES) {
        return -1;
    }
    mac  = &c[0];
    ct   = &c[hydro_kx_AEAD_MACBYTES];
    mlen = clen - hydro_kx_AEAD_MACBYTES;
    memcpy(pub_mac, mac, sizeof pub_mac);
    hydro_kx_aead_init(aead_state, k, state);
    hydro_hash_update(&state->h_st, c, clen);
    hydro_kx_aead_xor_dec(aead_state, m, ct, mlen);
    hydro_kx_aead_final(aead_state, k);
    COMPILER_ASSERT(hydro_kx_AEAD_MACBYTES <= gimli_CAPACITY);
    COMPILER_ASSERT(gimli_RATE % 4 == 0);
    cv = hydro_mem_ct_cmp_u32(int_state + gimli_RATE / 4, pub_mac, hydro_kx_AEAD_MACBYTES / 4);
    hydro_mem_ct_zero_u32(int_state, gimli_BLOCKBYTES / 4);
    if (cv != 0) {
        mem_zero(m, mlen);
        return -1;
    }
    return 0;
}